

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow_sse4.c
# Opt level: O0

void compute_flow_vector(uint8_t *src,uint8_t *ref,int width,int height,int stride,int x,int y,
                        double u,double v,int16_t *dx,int16_t *dy,int *b)

{
  long lVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined8 uVar34;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  double in_XMM0_Qa;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar40;
  undefined1 auVar39 [32];
  double in_XMM1_Qa;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int in_stack_00000008;
  undefined4 in_stack_00000014;
  __m256i dy_row;
  __m256i dx_row;
  __m256i dt;
  __m256i src_pixels;
  __m128i src_pixels_u8;
  __m256i warped;
  __m256i sum1_rounded;
  __m256i sum0_rounded;
  __m256i sum1_1;
  __m256i sum0_1;
  __m256i px3_1;
  __m256i px2_1;
  __m256i px1_1;
  __m256i px0_1;
  __m128i row4;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  int16_t *tmp_row_1;
  int i_1;
  __m256i v_kernel_23;
  __m256i v_kernel_01;
  __m256i round_const_v;
  int round_bits;
  __m256i out1;
  __m256i sum1;
  __m256i px3;
  __m256i px2;
  __m256i out0;
  __m256i sum0;
  __m256i px1;
  __m256i px0;
  __m256i px_4to10_i16;
  __m256i px_0to7_i16;
  __m256i row;
  int16_t *tmp_row;
  uint8_t *ref_row;
  int y_w;
  int i;
  __m256i round_const_h;
  __m256i h_kernel_23;
  __m256i h_kernel_01;
  int y0;
  int x0;
  int16_t *tmp;
  int16_t tmp_ [96];
  __m128i kernels;
  double v_frac;
  double u_frac;
  int v_int;
  int u_int;
  __m256i b1_acc;
  __m256i b0_acc;
  __m256i zero;
  int local_12d0;
  int iStackY_12cc;
  int iStackY_12c8;
  int iStackY_12c4;
  undefined1 in_stack_ffffffffffffed40 [32];
  double in_stack_ffffffffffffed78;
  double in_stack_ffffffffffffed80;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  int local_1084;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  int local_e84;
  undefined8 local_e00 [26];
  double local_d30;
  undefined8 uStack_d28;
  double local_d18;
  double local_d10;
  int local_d08;
  int local_d04;
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  int local_c80;
  int local_c7c;
  int local_c78;
  int local_c74;
  long local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 local_ba0 [16];
  undefined1 auStack_b90 [16];
  undefined4 local_b64;
  undefined1 local_b60 [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined1 local_b00 [32];
  undefined8 *local_ae0;
  undefined8 *local_ad8;
  undefined8 *local_ad0;
  undefined8 *local_ac8;
  undefined8 *local_ac0;
  undefined8 *local_ab8;
  undefined1 (*local_ab0) [32];
  undefined1 (*local_aa8) [32];
  undefined1 local_aa0 [32];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined1 local_a60 [32];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [16];
  undefined1 auStack_890 [16];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [32];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_740 [32];
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6c0 [32];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_550 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  double local_500;
  undefined8 uStack_4f8;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined4 local_344;
  undefined1 local_340 [32];
  undefined4 local_304;
  undefined1 local_300 [32];
  undefined4 local_2c4;
  undefined1 local_2c0 [32];
  undefined4 local_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined4 local_a0;
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined1 local_80 [16];
  undefined1 auStack_70 [16];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  auVar36 = ZEXT816(0) << 0x40;
  local_c40 = ZEXT1632(auVar36);
  local_cc0 = 0;
  uStack_cb8 = 0;
  uStack_cb0 = 0;
  uStack_ca8 = 0;
  local_ce0 = ZEXT832(0);
  local_d00 = ZEXT1632(auVar36);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = in_XMM0_Qa;
  auVar36 = vroundsd_avx(auVar36,auVar41,9);
  local_d04 = (int)auVar36._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = in_XMM1_Qa;
  auVar36 = vroundsd_avx(auVar36,auVar42,9);
  local_d08 = (int)auVar36._0_8_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = in_XMM0_Qa;
  auVar36 = vroundsd_avx(auVar42,auVar37,9);
  dVar35 = in_XMM0_Qa - auVar36._0_8_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = in_XMM1_Qa;
  auVar36 = vroundsd_avx(auVar36,auVar38,9);
  local_d18 = in_XMM1_Qa - auVar36._0_8_;
  uVar40 = 0;
  local_d10 = dVar35;
  local_c80 = in_R9D;
  local_c7c = in_R8D;
  local_c78 = in_ECX;
  local_c74 = in_EDX;
  local_c68 = in_RDI;
  local_c60 = local_d00;
  local_c20 = local_c40;
  compute_cubic_kernels(in_stack_ffffffffffffed80,in_stack_ffffffffffffed78);
  local_d30 = dVar35;
  uStack_d28 = uVar40;
  clamp(local_c80 + local_d04,-9,local_c74);
  clamp(in_stack_00000008 + local_d08,-9,local_c78);
  local_500 = local_d30;
  dVar35 = local_500;
  uStack_4f8 = uStack_d28;
  local_500._0_4_ = SUB84(local_d30,0);
  uVar33 = local_500._0_4_;
  auVar36._8_8_ = uStack_d28;
  auVar36._0_8_ = local_d30;
  local_510 = vpsrldq_avx(auVar36,8);
  uVar32 = local_510._0_4_;
  local_4e4 = 0x80;
  local_84 = 0x80;
  local_88 = 0x80;
  local_8c = 0x80;
  local_90 = 0x80;
  local_94 = 0x80;
  local_98 = 0x80;
  local_9c = 0x80;
  local_a0 = 0x80;
  auVar36 = vpinsrd_avx(ZEXT416(0x80),0x80,1);
  auVar36 = vpinsrd_avx(auVar36,0x80,2);
  auVar36 = vpinsrd_avx(auVar36,0x80,3);
  auVar37 = vpinsrd_avx(ZEXT416(0x80),0x80,1);
  auVar37 = vpinsrd_avx(auVar37,0x80,2);
  auVar37 = vpinsrd_avx(auVar37,0x80,3);
  auVar39._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar37;
  auVar39._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
  local_c0._16_8_ = auVar39._16_8_;
  uVar40 = local_c0._16_8_;
  local_c0._24_8_ = auVar39._24_8_;
  uVar34 = local_c0._24_8_;
  local_500 = dVar35;
  local_c0 = auVar39;
  auVar36 = auVar39._0_16_;
  auVar37 = auVar39._16_16_;
  for (local_e84 = -1; local_e84 < 10; local_e84 = local_e84 + 2) {
    lVar1 = (long)(local_e84 << 3) * 2;
    puVar2 = (undefined8 *)((long)local_e00 + lVar1 + 0x10);
    auVar38 = auVar36;
    auVar41 = auVar37;
    yy_loadu2_128(in_stack_ffffffffffffed40._8_8_,in_stack_ffffffffffffed40._0_8_);
    local_bc0 = local_cc0;
    uStack_bb8 = uStack_cb8;
    uStack_bb0 = uStack_cb0;
    uStack_ba8 = uStack_ca8;
    auVar8._16_8_ = auVar41._0_8_;
    auVar8._0_16_ = auVar38;
    auVar8._24_8_ = auVar41._8_8_;
    auVar5._8_8_ = uStack_cb8;
    auVar5._0_8_ = local_cc0;
    auVar5._16_8_ = uStack_cb0;
    auVar5._24_8_ = uStack_ca8;
    local_380 = vpunpcklbw_avx2(auVar8,auVar5);
    auVar3._16_8_ = auVar41._0_8_;
    auVar3._0_16_ = auVar38;
    auVar3._24_8_ = auVar41._8_8_;
    local_be0 = vpsrldq_avx2(auVar3,4);
    local_c00 = local_cc0;
    uStack_bf8 = uStack_cb8;
    uStack_bf0 = uStack_cb0;
    uStack_be8 = uStack_ca8;
    auVar4._8_8_ = uStack_cb8;
    auVar4._0_8_ = local_cc0;
    auVar4._16_8_ = uStack_cb0;
    auVar4._24_8_ = uStack_ca8;
    local_400 = vpunpcklbw_avx2(local_be0,auVar4);
    local_3a0 = vpsrldq_avx2(local_380,2);
    auVar3 = vpunpcklwd_avx2(local_380,local_3a0);
    local_3c0 = vpsrldq_avx2(local_380,4);
    local_3e0 = vpsrldq_avx2(local_380,6);
    auVar4 = vpunpcklwd_avx2(local_3c0,local_3e0);
    local_f20 = auVar3._0_8_;
    uStack_f18 = auVar3._8_8_;
    uStack_f10 = auVar3._16_8_;
    uStack_f08 = auVar3._24_8_;
    local_5e0 = CONCAT44(uVar33,uVar33);
    uStack_5d8 = CONCAT44(uVar33,uVar33);
    uStack_5d0 = CONCAT44(uVar33,uVar33);
    uStack_5c8 = CONCAT44(uVar33,uVar33);
    local_5c0 = local_f20;
    uStack_5b8 = uStack_f18;
    uStack_5b0 = uStack_f10;
    uStack_5a8 = uStack_f08;
    auVar20._8_8_ = uStack_5d8;
    auVar20._0_8_ = local_5e0;
    auVar20._16_8_ = uStack_5d0;
    auVar20._24_8_ = uStack_5c8;
    local_840 = vpmaddwd_avx2(auVar3,auVar20);
    local_f40 = auVar4._0_8_;
    uStack_f38 = auVar4._8_8_;
    uStack_f30 = auVar4._16_8_;
    uStack_f28 = auVar4._24_8_;
    local_620 = CONCAT44(uVar32,uVar32);
    uStack_618 = CONCAT44(uVar32,uVar32);
    uStack_610 = CONCAT44(uVar32,uVar32);
    uStack_608 = CONCAT44(uVar32,uVar32);
    local_600 = local_f40;
    uStack_5f8 = uStack_f38;
    uStack_5f0 = uStack_f30;
    uStack_5e8 = uStack_f28;
    auVar19._8_8_ = uStack_618;
    auVar19._0_8_ = local_620;
    auVar19._16_8_ = uStack_610;
    auVar19._24_8_ = uStack_608;
    local_860 = vpmaddwd_avx2(auVar4,auVar19);
    auVar3 = vpaddd_avx2(local_840,local_860);
    local_f60 = auVar3._0_8_;
    uStack_f58 = auVar3._8_8_;
    uStack_f50 = auVar3._16_8_;
    uStack_f48 = auVar3._24_8_;
    local_880 = local_f60;
    uStack_878 = uStack_f58;
    uStack_870 = uStack_f50;
    uStack_868 = uStack_f48;
    auVar12._16_8_ = uVar40;
    auVar12._0_16_ = auVar39._0_16_;
    auVar12._24_8_ = uVar34;
    local_280 = vpaddd_avx2(auVar3,auVar12);
    local_284 = 8;
    auVar4 = vpsrad_avx2(local_280,ZEXT416(8));
    local_420 = vpsrldq_avx2(local_400,2);
    auVar3 = vpunpcklwd_avx2(local_400,local_420);
    local_440 = vpsrldq_avx2(local_400,4);
    local_460 = vpsrldq_avx2(local_400,6);
    auVar5 = vpunpcklwd_avx2(local_440,local_460);
    local_fa0 = auVar3._0_8_;
    uStack_f98 = auVar3._8_8_;
    uStack_f90 = auVar3._16_8_;
    uStack_f88 = auVar3._24_8_;
    local_660 = CONCAT44(uVar33,uVar33);
    uStack_658 = CONCAT44(uVar33,uVar33);
    uStack_650 = CONCAT44(uVar33,uVar33);
    uStack_648 = CONCAT44(uVar33,uVar33);
    local_640 = local_fa0;
    uStack_638 = uStack_f98;
    uStack_630 = uStack_f90;
    uStack_628 = uStack_f88;
    auVar18._8_8_ = uStack_658;
    auVar18._0_8_ = local_660;
    auVar18._16_8_ = uStack_650;
    auVar18._24_8_ = uStack_648;
    local_8c0 = vpmaddwd_avx2(auVar3,auVar18);
    local_fc0 = auVar5._0_8_;
    uStack_fb8 = auVar5._8_8_;
    uStack_fb0 = auVar5._16_8_;
    uStack_fa8 = auVar5._24_8_;
    local_6a0 = CONCAT44(uVar32,uVar32);
    uStack_698 = CONCAT44(uVar32,uVar32);
    uStack_690 = CONCAT44(uVar32,uVar32);
    uStack_688 = CONCAT44(uVar32,uVar32);
    local_680 = local_fc0;
    uStack_678 = uStack_fb8;
    uStack_670 = uStack_fb0;
    uStack_668 = uStack_fa8;
    auVar17._8_8_ = uStack_698;
    auVar17._0_8_ = local_6a0;
    auVar17._16_8_ = uStack_690;
    auVar17._24_8_ = uStack_688;
    local_8e0 = vpmaddwd_avx2(auVar5,auVar17);
    auVar3 = vpaddd_avx2(local_8c0,local_8e0);
    local_fe0 = auVar3._0_8_;
    uStack_fd8 = auVar3._8_8_;
    uStack_fd0 = auVar3._16_8_;
    uStack_fc8 = auVar3._24_8_;
    local_900 = local_fe0;
    uStack_8f8 = uStack_fd8;
    uStack_8f0 = uStack_fd0;
    uStack_8e8 = uStack_fc8;
    auVar11._16_8_ = uVar40;
    auVar11._0_16_ = auVar39._0_16_;
    auVar11._24_8_ = uVar34;
    local_2c0 = vpaddd_avx2(auVar3,auVar11);
    local_2c4 = 8;
    auVar3 = vpsrad_avx2(local_2c0,ZEXT416(8));
    local_f80 = auVar4._0_8_;
    uStack_f78 = auVar4._8_8_;
    uStack_f70 = auVar4._16_8_;
    uStack_f68 = auVar4._24_8_;
    local_1000 = auVar3._0_8_;
    uStack_ff8 = auVar3._8_8_;
    uStack_ff0 = auVar3._16_8_;
    uStack_fe8 = auVar3._24_8_;
    local_200 = local_f80;
    uStack_1f8 = uStack_f78;
    uStack_1f0 = uStack_f70;
    uStack_1e8 = uStack_f68;
    local_220 = local_1000;
    uStack_218 = uStack_ff8;
    uStack_210 = uStack_ff0;
    uStack_208 = uStack_fe8;
    local_b00 = vpackssdw_avx2(auVar4,auVar3);
    uVar29 = local_b00._8_8_;
    auVar36 = local_b00._0_16_;
    uVar30 = local_b00._16_8_;
    uVar31 = local_b00._24_8_;
    auVar37 = local_b00._16_16_;
    local_ae0 = puVar2;
    local_ba0 = auVar38;
    auStack_b90 = auVar41;
    local_8a0 = auVar39._0_16_;
    auStack_890 = auVar39._16_16_;
    local_920 = auVar39._0_16_;
    auStack_910 = auVar39._16_16_;
    *puVar2 = local_b00._0_8_;
    *(undefined8 *)((long)local_e00 + lVar1 + 0x18) = uVar29;
    *(undefined8 *)((long)local_e00 + lVar1 + 0x20) = uVar30;
    *(undefined8 *)((long)local_e00 + lVar1 + 0x28) = uVar31;
  }
  local_4e8 = 0x10000;
  local_34 = 0x10000;
  local_38 = 0x10000;
  local_3c = 0x10000;
  local_40 = 0x10000;
  local_44 = 0x10000;
  local_48 = 0x10000;
  local_4c = 0x10000;
  local_50 = 0x10000;
  auVar36 = vpinsrd_avx(ZEXT416(0x10000),0x10000,1);
  auVar36 = vpinsrd_avx(auVar36,0x10000,2);
  auVar36 = vpinsrd_avx(auVar36,0x10000,3);
  auVar37 = vpinsrd_avx(ZEXT416(0x10000),0x10000,1);
  auVar37 = vpinsrd_avx(auVar37,0x10000,2);
  auStack_70 = vpinsrd_avx(auVar37,0x10000,3);
  local_80._0_8_ = auVar36._0_8_;
  uVar40 = local_80._0_8_;
  local_80._8_8_ = auVar36._8_8_;
  uVar34 = local_80._8_8_;
  uVar29 = auStack_70._0_8_;
  uVar30 = auStack_70._8_8_;
  auVar6._8_8_ = uStack_d28;
  auVar6._0_8_ = local_d30;
  local_520 = vpsrldq_avx(auVar6,4);
  uVar33 = local_520._0_4_;
  auVar7._8_8_ = uStack_d28;
  auVar7._0_8_ = local_d30;
  local_530 = vpsrldq_avx(auVar7,0xc);
  uVar32 = local_530._0_4_;
  local_80 = auVar36;
  for (local_1084 = 0; local_1084 < 8; local_1084 = local_1084 + 2) {
    lVar1 = (long)(local_1084 << 3) * 2;
    local_ac0 = (undefined8 *)((long)local_e00 + lVar1 + 0x10);
    local_ab8 = (undefined8 *)((long)local_e00 + lVar1);
    local_480 = *local_ab8;
    uStack_478 = *(undefined8 *)((long)local_e00 + lVar1 + 8);
    local_4a0 = *local_ac0;
    uStack_498 = *(undefined8 *)((long)local_e00 + lVar1 + 0x18);
    local_ac8 = (undefined8 *)((long)local_e00 + lVar1 + 0x20);
    local_4c0 = *local_ac8;
    uStack_4b8 = *(undefined8 *)((long)local_e00 + lVar1 + 0x28);
    local_ad0 = (undefined8 *)((long)local_e00 + lVar1 + 0x30);
    local_4e0 = *local_ad0;
    uStack_4d8 = *(undefined8 *)((long)local_e00 + lVar1 + 0x38);
    local_ad8 = (undefined8 *)((long)local_e00 + lVar1 + 0x40);
    uStack_4d0 = *local_ad8;
    uStack_4c8 = *(undefined8 *)((long)local_e00 + lVar1 + 0x48);
    auVar24._8_8_ = uStack_478;
    auVar24._0_8_ = local_480;
    auVar24._16_8_ = local_4a0;
    auVar24._24_8_ = uStack_498;
    auVar23._8_8_ = uStack_498;
    auVar23._0_8_ = local_4a0;
    auVar23._16_8_ = local_4c0;
    auVar23._24_8_ = uStack_4b8;
    local_6c0 = vpunpcklwd_avx2(auVar24,auVar23);
    local_6e0 = CONCAT44(uVar33,uVar33);
    uStack_6d8 = CONCAT44(uVar33,uVar33);
    uStack_6d0 = CONCAT44(uVar33,uVar33);
    uStack_6c8 = CONCAT44(uVar33,uVar33);
    auVar16._8_8_ = uStack_6d8;
    auVar16._0_8_ = local_6e0;
    auVar16._16_8_ = uStack_6d0;
    auVar16._24_8_ = uStack_6c8;
    local_940 = vpmaddwd_avx2(local_6c0,auVar16);
    auVar22._8_8_ = uStack_4b8;
    auVar22._0_8_ = local_4c0;
    auVar22._16_8_ = local_4e0;
    auVar22._24_8_ = uStack_4d8;
    auVar21._8_8_ = uStack_4d8;
    auVar21._0_8_ = local_4e0;
    auVar21._16_8_ = uStack_4d0;
    auVar21._24_8_ = uStack_4c8;
    local_700 = vpunpcklwd_avx2(auVar22,auVar21);
    local_720 = CONCAT44(uVar32,uVar32);
    uStack_718 = CONCAT44(uVar32,uVar32);
    uStack_710 = CONCAT44(uVar32,uVar32);
    uStack_708 = CONCAT44(uVar32,uVar32);
    auVar15._8_8_ = uStack_718;
    auVar15._0_8_ = local_720;
    auVar15._16_8_ = uStack_710;
    auVar15._24_8_ = uStack_708;
    local_960 = vpmaddwd_avx2(local_700,auVar15);
    auVar39 = vpaddd_avx2(local_940,local_960);
    auVar28._8_8_ = uStack_478;
    auVar28._0_8_ = local_480;
    auVar28._16_8_ = local_4a0;
    auVar28._24_8_ = uStack_498;
    auVar27._8_8_ = uStack_498;
    auVar27._0_8_ = local_4a0;
    auVar27._16_8_ = local_4c0;
    auVar27._24_8_ = uStack_4b8;
    local_740 = vpunpckhwd_avx2(auVar28,auVar27);
    local_760 = CONCAT44(uVar33,uVar33);
    uStack_758 = CONCAT44(uVar33,uVar33);
    uStack_750 = CONCAT44(uVar33,uVar33);
    uStack_748 = CONCAT44(uVar33,uVar33);
    auVar14._8_8_ = uStack_758;
    auVar14._0_8_ = local_760;
    auVar14._16_8_ = uStack_750;
    auVar14._24_8_ = uStack_748;
    local_980 = vpmaddwd_avx2(local_740,auVar14);
    auVar26._8_8_ = uStack_4b8;
    auVar26._0_8_ = local_4c0;
    auVar26._16_8_ = local_4e0;
    auVar26._24_8_ = uStack_4d8;
    auVar25._8_8_ = uStack_4d8;
    auVar25._0_8_ = local_4e0;
    auVar25._16_8_ = uStack_4d0;
    auVar25._24_8_ = uStack_4c8;
    local_780 = vpunpckhwd_avx2(auVar26,auVar25);
    local_7a0 = CONCAT44(uVar32,uVar32);
    uStack_798 = CONCAT44(uVar32,uVar32);
    uStack_790 = CONCAT44(uVar32,uVar32);
    uStack_788 = CONCAT44(uVar32,uVar32);
    auVar13._8_8_ = uStack_798;
    auVar13._0_8_ = local_7a0;
    auVar13._16_8_ = uStack_790;
    auVar13._24_8_ = uStack_788;
    local_9a0 = vpmaddwd_avx2(local_780,auVar13);
    auVar3 = vpaddd_avx2(local_980,local_9a0);
    local_1180 = auVar39._0_8_;
    uStack_1178 = auVar39._8_8_;
    uStack_1170 = auVar39._16_8_;
    uStack_1168 = auVar39._24_8_;
    local_9c0 = local_1180;
    uStack_9b8 = uStack_1178;
    uStack_9b0 = uStack_1170;
    uStack_9a8 = uStack_1168;
    local_9e0 = uVar40;
    uStack_9d8 = uVar34;
    uStack_9d0 = uVar29;
    uStack_9c8 = uVar30;
    auVar10._16_8_ = uVar29;
    auVar10._0_16_ = auVar36;
    auVar10._24_8_ = uVar30;
    local_300 = vpaddd_avx2(auVar39,auVar10);
    local_304 = 0x11;
    auVar39 = vpsrad_avx2(local_300,ZEXT416(0x11));
    local_11a0 = auVar3._0_8_;
    uStack_1198 = auVar3._8_8_;
    uStack_1190 = auVar3._16_8_;
    uStack_1188 = auVar3._24_8_;
    local_a00 = local_11a0;
    uStack_9f8 = uStack_1198;
    uStack_9f0 = uStack_1190;
    uStack_9e8 = uStack_1188;
    local_a20 = uVar40;
    uStack_a18 = uVar34;
    uStack_a10 = uVar29;
    uStack_a08 = uVar30;
    auVar9._16_8_ = uVar29;
    auVar9._0_16_ = auVar36;
    auVar9._24_8_ = uVar30;
    local_340 = vpaddd_avx2(auVar3,auVar9);
    local_344 = 0x11;
    auVar3 = vpsrad_avx2(local_340,ZEXT416(0x11));
    local_11c0 = auVar39._0_8_;
    uStack_11b8 = auVar39._8_8_;
    uStack_11b0 = auVar39._16_8_;
    uStack_11a8 = auVar39._24_8_;
    local_11e0 = auVar3._0_8_;
    uStack_11d8 = auVar3._8_8_;
    uStack_11d0 = auVar3._16_8_;
    uStack_11c8 = auVar3._24_8_;
    local_240 = local_11c0;
    uStack_238 = uStack_11b8;
    uStack_230 = uStack_11b0;
    uStack_228 = uStack_11a8;
    local_260 = local_11e0;
    uStack_258 = uStack_11d8;
    uStack_250 = uStack_11d0;
    uStack_248 = uStack_11c8;
    auVar39 = vpackssdw_avx2(auVar39,auVar3);
    auVar37 = auVar39._0_16_;
    uStack_4b0 = local_4e0;
    uStack_4a8 = uStack_4d8;
    uStack_490 = local_4c0;
    uStack_488 = uStack_4b8;
    uStack_470 = local_4a0;
    uStack_468 = uStack_498;
    local_1e0 = local_4e0;
    uStack_1d8 = uStack_4d8;
    local_1d0 = uStack_4d0;
    uStack_1c8 = uStack_4c8;
    local_1c0 = local_4c0;
    uStack_1b8 = uStack_4b8;
    local_1b0 = local_4e0;
    uStack_1a8 = uStack_4d8;
    local_1a0 = local_4a0;
    uStack_198 = uStack_498;
    local_190 = local_4c0;
    uStack_188 = uStack_4b8;
    local_180 = local_480;
    uStack_178 = uStack_478;
    local_170 = local_4a0;
    uStack_168 = uStack_498;
    local_160 = local_4e0;
    uStack_158 = uStack_4d8;
    uStack_150 = uStack_4d0;
    uStack_148 = uStack_4c8;
    local_140 = local_4c0;
    uStack_138 = uStack_4b8;
    uStack_130 = local_4e0;
    uStack_128 = uStack_4d8;
    local_120 = local_4a0;
    uStack_118 = uStack_498;
    uStack_110 = local_4c0;
    uStack_108 = uStack_4b8;
    local_100 = local_480;
    uStack_f8 = uStack_478;
    uStack_f0 = local_4a0;
    uStack_e8 = uStack_498;
    xx_loadu_2x64((void *)(local_c68 +
                          ((in_stack_00000008 + local_1084 + 1) * local_c7c + local_c80)),
                  (void *)(local_c68 + ((in_stack_00000008 + local_1084) * local_c7c + local_c80)));
    local_1210 = auVar37._0_8_;
    local_d0 = local_1210;
    uStack_1208 = auVar37._8_8_;
    uStack_c8 = uStack_1208;
    local_b60 = vpmovzxbw_avx2(auVar37);
    local_b64 = 3;
    auVar3 = vpsllw_avx2(local_b60,ZEXT416(3));
    local_1200 = auVar39._0_8_;
    local_b20 = local_1200;
    uStack_11f8 = auVar39._8_8_;
    uStack_b18 = uStack_11f8;
    uStack_11f0 = auVar39._16_8_;
    uStack_b10 = uStack_11f0;
    uStack_11e8 = auVar39._24_8_;
    uStack_b08 = uStack_11e8;
    local_1240 = auVar3._0_8_;
    local_b40 = local_1240;
    uStack_1238 = auVar3._8_8_;
    uStack_b38 = uStack_1238;
    uStack_1230 = auVar3._16_8_;
    uStack_b30 = uStack_1230;
    uStack_1228 = auVar3._24_8_;
    uStack_b28 = uStack_1228;
    auVar39 = vpsubw_avx2(auVar39,auVar3);
    local_aa8 = (undefined1 (*) [32])(CONCAT44(in_stack_00000014,y) + (long)(local_1084 << 3) * 2);
    local_7c0 = *(undefined8 *)*local_aa8;
    uStack_7b8 = *(undefined8 *)(*local_aa8 + 8);
    uStack_7b0 = *(undefined8 *)(*local_aa8 + 0x10);
    uStack_7a8 = *(undefined8 *)(*local_aa8 + 0x18);
    local_ab0 = (undefined1 (*) [32])(dx + (local_1084 << 3));
    local_800 = *(undefined8 *)*local_ab0;
    uStack_7f8 = *(undefined8 *)(*local_ab0 + 8);
    uStack_7f0 = *(undefined8 *)(*local_ab0 + 0x10);
    uStack_7e8 = *(undefined8 *)(*local_ab0 + 0x18);
    local_a40 = local_ce0._0_8_;
    uStack_a38 = local_ce0._8_8_;
    uStack_a30 = local_ce0._16_8_;
    uStack_a28 = local_ce0._24_8_;
    local_1260 = auVar39._0_8_;
    local_7e0 = local_1260;
    uStack_1258 = auVar39._8_8_;
    uStack_7d8 = uStack_1258;
    uStack_1250 = auVar39._16_8_;
    uStack_7d0 = uStack_1250;
    uStack_1248 = auVar39._24_8_;
    uStack_7c8 = uStack_1248;
    local_a60 = vpmaddwd_avx2(*local_aa8,auVar39);
    local_ce0 = vpaddd_avx2(local_ce0,local_a60);
    local_a80 = local_d00._0_8_;
    uStack_a78 = local_d00._8_8_;
    uStack_a70 = local_d00._16_8_;
    uStack_a68 = local_d00._24_8_;
    local_820 = local_1260;
    uStack_818 = uStack_1258;
    uStack_810 = uStack_1250;
    uStack_808 = uStack_1248;
    local_aa0 = vpmaddwd_avx2(*local_ab0,auVar39);
    local_d00 = vpaddd_avx2(local_d00,local_aa0);
  }
  auVar39 = vphaddd_avx2(local_ce0,local_d00);
  auVar36 = vpaddd_avx(auVar39._16_16_,local_550);
  local_12d0 = auVar36._0_4_;
  iStackY_12cc = auVar36._4_4_;
  *(int *)dy = local_12d0 + iStackY_12cc;
  iStackY_12c8 = auVar36._8_4_;
  iStackY_12c4 = auVar36._12_4_;
  *(int *)(dy + 2) = iStackY_12c8 + iStackY_12c4;
  return;
}

Assistant:

static inline void compute_flow_vector(const uint8_t *src, const uint8_t *ref,
                                       int width, int height, int stride, int x,
                                       int y, double u, double v,
                                       const int16_t *dx, const int16_t *dy,
                                       int *b) {
  // This function is written to do 8x8 convolutions only
  assert(DISFLOW_PATCH_SIZE == 8);

  // Accumulate 4 32-bit partial sums for each element of b
  // These will be flattened at the end.
  __m128i b0_acc = _mm_setzero_si128();
  __m128i b1_acc = _mm_setzero_si128();

  // Split offset into integer and fractional parts, and compute cubic
  // interpolation kernels
  const int u_int = (int)floor(u);
  const int v_int = (int)floor(v);
  const double u_frac = u - floor(u);
  const double v_frac = v - floor(v);

  const __m128i kernels = compute_cubic_kernels(u_frac, v_frac);

  // Storage for intermediate values between the two convolution directions
  DECLARE_ALIGNED(16, int16_t,
                  tmp_[DISFLOW_PATCH_SIZE * (DISFLOW_PATCH_SIZE + 3)]);
  int16_t *tmp = tmp_ + DISFLOW_PATCH_SIZE;  // Offset by one row

  // Clamp coordinates so that all pixels we fetch will remain within the
  // allocated border region, but allow them to go far enough out that
  // the border pixels' values do not change.
  // Since we are calculating an 8x8 block, the bottom-right pixel
  // in the block has coordinates (x0 + 7, y0 + 7). Then, the cubic
  // interpolation has 4 taps, meaning that the output of pixel
  // (x_w, y_w) depends on the pixels in the range
  // ([x_w - 1, x_w + 2], [y_w - 1, y_w + 2]).
  //
  // Thus the most extreme coordinates which will be fetched are
  // (x0 - 1, y0 - 1) and (x0 + 9, y0 + 9).
  const int x0 = clamp(x + u_int, -9, width);
  const int y0 = clamp(y + v_int, -9, height);

  // Horizontal convolution

  // Prepare the kernel vectors
  // We split the kernel into two vectors with kernel indices:
  // 0, 1, 0, 1, 0, 1, 0, 1, and
  // 2, 3, 2, 3, 2, 3, 2, 3
  __m128i h_kernel_01 = _mm_set1_epi32(_mm_extract_epi32(kernels, 0));
  __m128i h_kernel_23 = _mm_set1_epi32(_mm_extract_epi32(kernels, 2));

  __m128i round_const_h = _mm_set1_epi32(1 << (DISFLOW_INTERP_BITS - 6 - 1));

  for (int i = -1; i < DISFLOW_PATCH_SIZE + 2; ++i) {
    const int y_w = y0 + i;
    const uint8_t *ref_row = &ref[y_w * stride + (x0 - 1)];
    int16_t *tmp_row = &tmp[i * DISFLOW_PATCH_SIZE];

    // Load this row of pixels.
    // For an 8x8 patch, we need to load the 8 image pixels + 3 extras,
    // for a total of 11 pixels. Here we load 16 pixels, but only use
    // the first 11.
    __m128i row = _mm_loadu_si128((__m128i *)ref_row);

    // Expand pixels to int16s
    __m128i px_0to7_i16 = _mm_cvtepu8_epi16(row);
    __m128i px_4to10_i16 = _mm_cvtepu8_epi16(_mm_srli_si128(row, 4));

    // Compute first four outputs
    // input pixels 0, 1, 1, 2, 2, 3, 3, 4
    // * kernel     0, 1, 0, 1, 0, 1, 0, 1
    __m128i px0 =
        _mm_unpacklo_epi16(px_0to7_i16, _mm_srli_si128(px_0to7_i16, 2));
    // input pixels 2, 3, 3, 4, 4, 5, 5, 6
    // * kernel     2, 3, 2, 3, 2, 3, 2, 3
    __m128i px1 = _mm_unpacklo_epi16(_mm_srli_si128(px_0to7_i16, 4),
                                     _mm_srli_si128(px_0to7_i16, 6));
    // Convolve with kernel and sum 2x2 boxes to form first 4 outputs
    __m128i sum0 = _mm_add_epi32(_mm_madd_epi16(px0, h_kernel_01),
                                 _mm_madd_epi16(px1, h_kernel_23));

    __m128i out0 = _mm_srai_epi32(_mm_add_epi32(sum0, round_const_h),
                                  DISFLOW_INTERP_BITS - 6);

    // Compute second four outputs
    __m128i px2 =
        _mm_unpacklo_epi16(px_4to10_i16, _mm_srli_si128(px_4to10_i16, 2));
    __m128i px3 = _mm_unpacklo_epi16(_mm_srli_si128(px_4to10_i16, 4),
                                     _mm_srli_si128(px_4to10_i16, 6));
    __m128i sum1 = _mm_add_epi32(_mm_madd_epi16(px2, h_kernel_01),
                                 _mm_madd_epi16(px3, h_kernel_23));

    // Round by just enough bits that the result is
    // guaranteed to fit into an i16. Then the next stage can use 16 x 16 -> 32
    // bit multiplies, which should be a fair bit faster than 32 x 32 -> 32
    // as it does now
    // This means shifting down so we have 6 extra bits, for a maximum value
    // of +18360, which can occur if u_frac == 0.5 and the input pixels are
    // {0, 255, 255, 0}.
    __m128i out1 = _mm_srai_epi32(_mm_add_epi32(sum1, round_const_h),
                                  DISFLOW_INTERP_BITS - 6);

    _mm_storeu_si128((__m128i *)tmp_row, _mm_packs_epi32(out0, out1));
  }

  // Vertical convolution
  const int round_bits = DISFLOW_INTERP_BITS + 6 - DISFLOW_DERIV_SCALE_LOG2;
  __m128i round_const_v = _mm_set1_epi32(1 << (round_bits - 1));

  __m128i v_kernel_01 = _mm_set1_epi32(_mm_extract_epi32(kernels, 1));
  __m128i v_kernel_23 = _mm_set1_epi32(_mm_extract_epi32(kernels, 3));

  for (int i = 0; i < DISFLOW_PATCH_SIZE; ++i) {
    int16_t *tmp_row = &tmp[i * DISFLOW_PATCH_SIZE];

    // Load 4 rows of 8 x 16-bit values
    __m128i px0 = _mm_loadu_si128((__m128i *)(tmp_row - DISFLOW_PATCH_SIZE));
    __m128i px1 = _mm_loadu_si128((__m128i *)tmp_row);
    __m128i px2 = _mm_loadu_si128((__m128i *)(tmp_row + DISFLOW_PATCH_SIZE));
    __m128i px3 =
        _mm_loadu_si128((__m128i *)(tmp_row + 2 * DISFLOW_PATCH_SIZE));

    // We want to calculate px0 * v_kernel[0] + px1 * v_kernel[1] + ... ,
    // but each multiply expands its output to 32 bits. So we need to be
    // a little clever about how we do this
    __m128i sum0 = _mm_add_epi32(
        _mm_madd_epi16(_mm_unpacklo_epi16(px0, px1), v_kernel_01),
        _mm_madd_epi16(_mm_unpacklo_epi16(px2, px3), v_kernel_23));
    __m128i sum1 = _mm_add_epi32(
        _mm_madd_epi16(_mm_unpackhi_epi16(px0, px1), v_kernel_01),
        _mm_madd_epi16(_mm_unpackhi_epi16(px2, px3), v_kernel_23));

    __m128i sum0_rounded =
        _mm_srai_epi32(_mm_add_epi32(sum0, round_const_v), round_bits);
    __m128i sum1_rounded =
        _mm_srai_epi32(_mm_add_epi32(sum1, round_const_v), round_bits);

    __m128i warped = _mm_packs_epi32(sum0_rounded, sum1_rounded);
    __m128i src_pixels_u8 =
        _mm_loadl_epi64((__m128i *)&src[(y + i) * stride + x]);
    __m128i src_pixels = _mm_slli_epi16(_mm_cvtepu8_epi16(src_pixels_u8), 3);

    // Calculate delta from the target patch
    __m128i dt = _mm_sub_epi16(warped, src_pixels);

    // Load 8 elements each of dx and dt, to pair with the 8 elements of dt
    // that we have just computed. Then compute 8 partial sums of dx * dt
    // and dy * dt, implicitly sum to give 4 partial sums of each, and
    // accumulate.
    __m128i dx_row = _mm_loadu_si128((__m128i *)&dx[i * DISFLOW_PATCH_SIZE]);
    __m128i dy_row = _mm_loadu_si128((__m128i *)&dy[i * DISFLOW_PATCH_SIZE]);
    b0_acc = _mm_add_epi32(b0_acc, _mm_madd_epi16(dx_row, dt));
    b1_acc = _mm_add_epi32(b1_acc, _mm_madd_epi16(dy_row, dt));
  }

  // Flatten the two sets of partial sums to find the final value of b
  // We need to set b[0] = sum(b0_acc), b[1] = sum(b1_acc).
  // We need to do 6 additions in total; a `hadd` instruction can take care
  // of four of them, leaving two scalar additions.
  __m128i partial_sum = _mm_hadd_epi32(b0_acc, b1_acc);
  b[0] = _mm_extract_epi32(partial_sum, 0) + _mm_extract_epi32(partial_sum, 1);
  b[1] = _mm_extract_epi32(partial_sum, 2) + _mm_extract_epi32(partial_sum, 3);
}